

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.h
# Opt level: O2

char * __thiscall
btHingeConstraint::serialize(btHingeConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btTransform::serialize(&this->m_rbAFrame,(btTransformFloatData *)((long)dataBuffer + 0x40));
  btTransform::serialize(&this->m_rbBFrame,(btTransformFloatData *)((long)dataBuffer + 0x80));
  *(uint *)((long)dataBuffer + 0xc4) = (uint)this->m_angularOnly;
  *(uint *)((long)dataBuffer + 200) = (uint)this->m_enableAngularMotor;
  *(undefined8 *)((long)dataBuffer + 0xcc) = *(undefined8 *)&this->m_motorTargetVelocity;
  *(uint *)((long)dataBuffer + 0xc0) = (uint)this->m_useReferenceFrameA;
  bVar1 = btAngularLimit::getLow(&this->m_limit);
  *(btScalar *)((long)dataBuffer + 0xd4) = bVar1;
  bVar1 = btAngularLimit::getHigh(&this->m_limit);
  *(btScalar *)((long)dataBuffer + 0xd8) = bVar1;
  *(undefined8 *)((long)dataBuffer + 0xdc) = *(undefined8 *)&(this->m_limit).m_softness;
  *(btScalar *)((long)dataBuffer + 0xe4) = (this->m_limit).m_relaxationFactor;
  return "btHingeConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btHingeConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btHingeConstraintData* hingeData = (btHingeConstraintData*)dataBuffer;
	btTypedConstraint::serialize(&hingeData->m_typeConstraintData,serializer);

	m_rbAFrame.serialize(hingeData->m_rbAFrame);
	m_rbBFrame.serialize(hingeData->m_rbBFrame);

	hingeData->m_angularOnly = m_angularOnly;
	hingeData->m_enableAngularMotor = m_enableAngularMotor;
	hingeData->m_maxMotorImpulse = float(m_maxMotorImpulse);
	hingeData->m_motorTargetVelocity = float(m_motorTargetVelocity);
	hingeData->m_useReferenceFrameA = m_useReferenceFrameA;
#ifdef	_BT_USE_CENTER_LIMIT_
	hingeData->m_lowerLimit = float(m_limit.getLow());
	hingeData->m_upperLimit = float(m_limit.getHigh());
	hingeData->m_limitSoftness = float(m_limit.getSoftness());
	hingeData->m_biasFactor = float(m_limit.getBiasFactor());
	hingeData->m_relaxationFactor = float(m_limit.getRelaxationFactor());
#else
	hingeData->m_lowerLimit = float(m_lowerLimit);
	hingeData->m_upperLimit = float(m_upperLimit);
	hingeData->m_limitSoftness = float(m_limitSoftness);
	hingeData->m_biasFactor = float(m_biasFactor);
	hingeData->m_relaxationFactor = float(m_relaxationFactor);
#endif

	return btHingeConstraintDataName;
}